

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

void __thiscall cppforth::Forth::writeFile(Forth *this)

{
  byte bVar1;
  uint uVar2;
  element_type *peVar3;
  char *pcVar4;
  undefined1 local_90 [4];
  iostate status;
  string fileData;
  uint caddr;
  size_t length;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  uint h;
  Forth *this_local;
  
  requireDStackDepth(this,3,"WRITE-FILE");
  f.
  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  uVar2 = f.
          super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"WRITE-FILE",&local_49);
  GetFileHandle((Forth *)local_28,(Cell)this,(string *)(ulong)uVar2,(errorCodes)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  fileData.field_2._12_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  std::__cxx11::string::string((string *)local_90);
  moveFromDataSpace(this,(string *)local_90,fileData.field_2._12_4_,(ulong)uVar2);
  peVar3 = std::
           __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  std::ios::clear((int)peVar3 + (int)*(undefined8 *)(*(long *)peVar3 + -0x18));
  peVar3 = std::
           __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90)
  ;
  std::ostream::write((char *)(peVar3 + 0x10),(long)pcVar4);
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_28);
  std::ios::rdstate();
  std::
  __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_28);
  bVar1 = std::ios::bad();
  uVar2 = 0;
  if ((bVar1 & 1) != 0) {
    uVar2 = 0xffffffb5;
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,uVar2);
  std::__cxx11::string::~string((string *)local_90);
  std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>::~shared_ptr
            ((shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *)local_28);
  return;
}

Assistant:

void writeFile() {
	REQUIRE_DSTACK_DEPTH(3, "WRITE-FILE");
	auto h = (dStack.getTop()); pop();
	auto f = GetFileHandle(h, "WRITE-FILE", errorWriteFile);
	auto length = SIZE_T(dStack.getTop()); pop();
	auto caddr = dStack.getTop();
	std::string fileData{};
	moveFromDataSpace(fileData, caddr, length);
	f->clear();
	f->write(fileData.c_str(), static_cast<std::streamsize>(length));
	auto status = f->rdstate();
	dStack.setTop(f->bad() ? Cell(errorWriteFile) : 0);
}